

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

void recff_ffi_fill(jit_State *J,RecordFFData *rd)

{
  CTInfo CVar1;
  jit_State *local_108;
  CType *ct;
  CTSize local_f8;
  CTSize sz;
  CTSize step;
  TRef trfill;
  TRef trlen;
  TRef trdst;
  CTState *cts;
  RecordFFData *rd_local;
  jit_State *J_local;
  CType *ct_1;
  CTState *local_c0;
  jit_State *local_b8;
  CTState *local_b0;
  jit_State *local_a8;
  CTState *local_a0;
  jit_State *local_98;
  CTState *local_90;
  uint local_84;
  CTState *local_80;
  uint local_74;
  CTState *local_70;
  uint local_64;
  CTState *local_60;
  undefined4 local_54;
  CTState *local_50;
  undefined4 local_44;
  CTState *local_40;
  uint local_34;
  CTState *local_30;
  uint local_24;
  CTState *local_20;
  uint local_14;
  CTState *local_10;
  
  _trlen = (CTState *)J[-1].penalty[0x3b].pc.ptr64;
  trfill = *J->base;
  step = J->base[1];
  sz = J->base[2];
  if ((trfill != 0) && (step != 0)) {
    local_f8 = 1;
    cts = (CTState *)rd;
    rd_local = (RecordFFData *)J;
    if ((int)(rd->argv->field_4).it >> 0xf == -0xb) {
      ct_1._4_4_ = (uint)*(ushort *)((rd->argv->u64 & 0x7fffffffffff) + 10);
      J_local = (jit_State *)(_trlen->tab + ct_1._4_4_);
      while ((uint)(J_local->cur).nextgc.gcptr64 >> 0x1c == 8) {
        local_98 = J_local;
        local_84 = (uint)(J_local->cur).nextgc.gcptr64 & 0xffff;
        J_local = (jit_State *)(_trlen->tab + local_84);
        local_90 = _trlen;
        local_80 = _trlen;
        local_14 = local_84;
        local_10 = _trlen;
      }
      local_108 = J_local;
      if ((uint)(J_local->cur).nextgc.gcptr64 >> 0x1c == 2) {
        local_b8 = J_local;
        do {
          local_a8 = local_b8;
          local_74 = (uint)(local_b8->cur).nextgc.gcptr64 & 0xffff;
          local_108 = (jit_State *)(_trlen->tab + local_74);
          local_b8 = local_108;
          local_b0 = _trlen;
          local_a0 = _trlen;
          local_70 = _trlen;
          local_24 = local_74;
          local_20 = _trlen;
        } while ((uint)(local_108->cur).nextgc.gcptr64 >> 0x1c == 8);
      }
      local_c0 = _trlen;
      local_64 = ct_1._4_4_;
      local_60 = _trlen;
      local_34 = ct_1._4_4_;
      local_30 = _trlen;
      CVar1 = lj_ctype_info(_trlen,(CTypeID)(((long)local_108 - (long)_trlen->tab) / 0x18),
                            (CTSize *)((long)&ct + 4));
      local_f8 = 1 << ((byte)(CVar1 >> 0x10) & 0xf);
    }
    local_50 = _trlen;
    local_54 = 0x11;
    local_40 = _trlen;
    local_44 = 0x11;
    trfill = crec_ct_tv((jit_State *)rd_local,_trlen->tab + 0x11,0,trfill,(cTValue *)cts->tab);
    step = crec_toint((jit_State *)rd_local,_trlen,step,(TValue *)&cts->tab->sib);
    if (sz == 0) {
      sz = lj_ir_kint((jit_State *)rd_local,0);
    }
    else {
      sz = crec_toint((jit_State *)rd_local,_trlen,sz,(TValue *)&cts->tab->name);
    }
    cts->top = 0;
    cts->sizetab = 0;
    crec_fill((jit_State *)rd_local,trfill,step,sz,local_f8);
  }
  return;
}

Assistant:

void LJ_FASTCALL recff_ffi_fill(jit_State *J, RecordFFData *rd)
{
  CTState *cts = ctype_ctsG(J2G(J));
  TRef trdst = J->base[0], trlen = J->base[1], trfill = J->base[2];
  if (trdst && trlen) {
    CTSize step = 1;
    if (tviscdata(&rd->argv[0])) {  /* Get alignment of original destination. */
      CTSize sz;
      CType *ct = ctype_raw(cts, cdataV(&rd->argv[0])->ctypeid);
      if (ctype_isptr(ct->info))
	ct = ctype_rawchild(cts, ct);
      step = (1u<<ctype_align(lj_ctype_info(cts, ctype_typeid(cts, ct), &sz)));
    }
    trdst = crec_ct_tv(J, ctype_get(cts, CTID_P_VOID), 0, trdst, &rd->argv[0]);
    trlen = crec_toint(J, cts, trlen, &rd->argv[1]);
    if (trfill)
      trfill = crec_toint(J, cts, trfill, &rd->argv[2]);
    else
      trfill = lj_ir_kint(J, 0);
    rd->nres = 0;
    crec_fill(J, trdst, trlen, trfill, step);
  }  /* else: interpreter will throw. */
}